

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::BasicWriter<char>::write_unsigned_decimal<unsigned_int>
          (BasicWriter<char> *this,uint value,uint prefix_size)

{
  uint uVar1;
  CharPtr pcVar2;
  
  uVar1 = internal::count_digits(value);
  pcVar2 = grow_buffer(this,(ulong)(uVar1 + prefix_size));
  internal::format_decimal<unsigned_int,char,fmt::internal::NoThousandsSep>
            (pcVar2 + prefix_size,value,uVar1);
  return pcVar2;
}

Assistant:

Char *write_unsigned_decimal(UInt value, unsigned prefix_size = 0) {
    unsigned num_digits = internal::count_digits(value);
    Char *ptr = get(grow_buffer(prefix_size + num_digits));
    internal::format_decimal(ptr + prefix_size, value, num_digits);
    return ptr;
  }